

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O2

void __thiscall Net::Zip(Net *this,string *FileName)

{
  pointer pvVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  ofstream out;
  
  std::ofstream::ofstream(&out,(string *)FileName,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    net_serializer<int,_void>::serialize((ostream *)&out,this->function_type);
    pvVar1 = (this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    net_serializer<int,_void>::serialize
              ((ostream *)&out,
               (int)((ulong)((long)*(pointer *)
                                    ((long)&(pvVar1->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + 8) -
                            *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                      _M_impl.super__Vector_impl_data) >> 3));
    net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
    ::serialize((ostream *)&out,&this->biases);
    net_serializer<std::vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>,_void>
    ::serialize((ostream *)&out,&this->weights);
    std::ofstream::~ofstream(&out);
    return;
  }
  std::operator+(&local_250,"File ",FileName);
  std::operator+(&local_230,&local_250," can\'t be written to\n");
  std::operator<<((ostream *)&std::cerr,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  exit(1);
}

Assistant:

void Net::Zip(const std::string& FileName){
    std::ofstream out(FileName, std::ios::binary);
    if (!out.is_open()){
        std::cerr << "File "+FileName+" can't be written to\n";
        exit(EXIT_FAILURE);
    }
    net_serializer<int>::serialize(out, (int)function_type);
    net_serializer<int>::serialize(out, (int)mesh[0].size());
    net_serializer<decltype(biases)>::serialize(out, biases);
    net_serializer<decltype(weights)>::serialize(out, weights);
}